

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O2

double __thiscall tri_cc_geom_t::get_tri_area(tri_cc_geom_t *this,cellid_t c)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  runtime_error *this_00;
  double dVar4;
  string asStack_1c8 [32];
  cellid_t pts [20];
  
  uVar2 = get_cell_dim(this,c);
  if (uVar2 == 2) {
    get_cell_points(this,c,pts);
    lVar1 = *(long *)&this->m_cell_pos;
    dVar4 = la::tri_area<double,3u>
                      ((type *)((long)pts[0] * 0x18 + lVar1),(type *)((long)pts[1] * 0x18 + lVar1),
                       (type *)((long)pts[2] * 0x18 + lVar1));
    return dVar4;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)pts);
  poVar3 = std::operator<<((ostream *)(pts + 4),"Failed to assert condition ");
  poVar3 = std::operator<<(poVar3,"get_cell_dim(c) == 2");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"at (");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                          );
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,"get_tri_area");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27d);
  std::operator<<(poVar3,") \n ");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double tri_cc_geom_t::get_tri_area(cellid_t c) const
{
  ASSERT(get_cell_dim(c) == 2);

  cellid_t pts[20];

  get_cell_points(c,pts);

  return la::tri_area<double,3>
      (m_cell_pos[pts[0]],m_cell_pos[pts[1]],m_cell_pos[pts[2]]);
}